

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O0

void PrintGraph(InstructionVMGraphContext *ctx,VmModule *module)

{
  VmFunction *local_20;
  VmFunction *value;
  VmModule *module_local;
  InstructionVMGraphContext *ctx_local;
  
  ctx->code = module->code;
  for (local_20 = (module->functions).head; local_20 != (VmFunction *)0x0; local_20 = local_20->next
      ) {
    PrintFunction(ctx,local_20);
  }
  PrintLine(ctx,"// Peephole optimizations: %d",(ulong)module->peepholeOptimizations);
  PrintLine(ctx,"// Constant propagations: %d",(ulong)module->constantPropagations);
  PrintLine(ctx,"// Dead code eliminations: %d",(ulong)module->deadCodeEliminations);
  PrintLine(ctx,"// Control flow simplifications: %d",(ulong)module->controlFlowSimplifications);
  PrintLine(ctx,"// Load store propagation: %d",(ulong)module->loadStorePropagations);
  PrintLine(ctx,"// Common subexpression eliminations: %d",(ulong)module->commonSubexprEliminations)
  ;
  PrintLine(ctx,"// Dead alloca store eliminations: %d",(ulong)module->deadAllocaStoreEliminations);
  PrintLine(ctx,"// Function inlines: %d",(ulong)module->functionInlines);
  OutputContext::Flush(ctx->output);
  return;
}

Assistant:

void PrintGraph(InstructionVMGraphContext &ctx, VmModule *module)
{
	ctx.code = module->code;

	for(VmFunction *value = module->functions.head; value; value = value->next)
		PrintFunction(ctx, value);

	PrintLine(ctx, "// Peephole optimizations: %d", module->peepholeOptimizations);
	PrintLine(ctx, "// Constant propagations: %d", module->constantPropagations);
	PrintLine(ctx, "// Dead code eliminations: %d", module->deadCodeEliminations);
	PrintLine(ctx, "// Control flow simplifications: %d", module->controlFlowSimplifications);
	PrintLine(ctx, "// Load store propagation: %d", module->loadStorePropagations);
	PrintLine(ctx, "// Common subexpression eliminations: %d", module->commonSubexprEliminations);
	PrintLine(ctx, "// Dead alloca store eliminations: %d", module->deadAllocaStoreEliminations);
	PrintLine(ctx, "// Function inlines: %d", module->functionInlines);

	ctx.output.Flush();
}